

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::CloneSurrogateCodeUnitsTo
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  bool bVar2;
  Char c_00;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uChar;
  Char c;
  uint i;
  CharSet<char16_t> *other_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  bVar2 = IsCompact(this);
  if (bVar2) {
    for (uChar = 0; uVar3 = GetCompactLength(this), uChar < uVar3; uChar = uChar + 1) {
      c_00 = GetCompactChar(this,uChar);
      uVar3 = Chars<char16_t>::CTU(c_00);
      if ((0xd7ff < uVar3) && (uVar3 < 0xe000)) {
        Set(other,allocator,c_00);
      }
    }
  }
  else {
    CharBitvec::CloneFrom(&(other->rep).full.direct,&(this->rep).full.direct);
    if ((this->rep).compact.countPlusOne == 0) {
      (other->rep).compact.countPlusOne = 0;
    }
    else {
      pCVar1 = (this->rep).full.root;
      iVar4 = (*pCVar1->_vptr_CharSetNode[1])(pCVar1,allocator);
      (other->rep).compact.countPlusOne = CONCAT44(extraout_var,iVar4);
      pCVar1 = (other->rep).full.root;
      (*pCVar1->_vptr_CharSetNode[3])(pCVar1,allocator,2,0,0xd7ff);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::CloneSurrogateCodeUnitsTo(ArenaAllocator* allocator, CharSet<Char>& other)
    {
        if (this->IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                Char c = this->GetCompactChar(i);
                uint uChar = CTU(c);
                if (0xD800 <= uChar && uChar <= 0xDFFF)
                {
                    other.Set(allocator, c);
                }
            }
        }
        else
        {
            other.rep.full.direct.CloneFrom(rep.full.direct);
            if (rep.full.root == nullptr)
            {
                other.rep.full.root = nullptr;
            }
            else
            {
                other.rep.full.root = rep.full.root->Clone(allocator);
                other.rep.full.root->ClearRange(allocator, CharSetNode::levels - 1, 0, 0xD7FF);
            }
        }
    }